

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::CountOnesFunction::checkArguments
          (CountOnesFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Expression *arg;
  bool bVar2;
  Type *pTVar3;
  SourceLocation SVar4;
  SourceRange sourceRange;
  
  SVar4 = range.startLoc;
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (bVar2) {
    bVar2 = Type::isBitstreamType(((*args->_M_ptr)->type).ptr,false);
    arg = *args->_M_ptr;
    if (!bVar2) {
      pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,arg);
      return pTVar3;
    }
    sourceRange.endLoc = SVar4;
    sourceRange.startLoc = (arg->sourceRange).endLoc;
    bVar2 = Bitstream::checkClassAccess
                      ((Bitstream *)(arg->type).ptr,(Type *)context,
                       (ASTContext *)(arg->sourceRange).startLoc,sourceRange);
    if (bVar2) {
      return pCVar1->intType;
    }
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isBitstreamType())
            return badArg(context, *args[0]);

        if (!Bitstream::checkClassAccess(*args[0]->type, context, args[0]->sourceRange))
            return comp.getErrorType();

        return comp.getIntType();
    }